

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O2

int __thiscall
aeron::Subscription::
poll<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
          (Subscription *this,
          function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
          *fragmentHandler,int fragmentLimit)

{
  __pointer_type pIVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  size_t i_1;
  Image *this_00;
  ulong uVar7;
  Image *this_01;
  
  pIVar1 = (this->m_imageList)._M_b._M_p;
  this_01 = pIVar1->m_images;
  uVar7 = pIVar1->m_length;
  uVar3 = this->m_roundRobinIndex;
  uVar6 = 0;
  uVar4 = uVar3 + 1;
  if (uVar7 <= uVar3) {
    uVar3 = uVar6;
    uVar4 = uVar6;
  }
  this->m_roundRobinIndex = uVar4;
  this_00 = this_01 + uVar3;
  for (uVar4 = uVar3; uVar4 < uVar7; uVar4 = uVar4 + 1) {
    iVar5 = (int)uVar6;
    if (fragmentLimit - iVar5 == 0 || fragmentLimit < iVar5) break;
    iVar2 = Image::
            poll<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                      (this_00,fragmentHandler,fragmentLimit - iVar5);
    uVar6 = (ulong)(uint)(iVar5 + iVar2);
    this_00 = this_00 + 1;
  }
  uVar7 = 0;
  while ((iVar5 = (int)uVar6, uVar7 < uVar3 &&
         (fragmentLimit - iVar5 != 0 && iVar5 <= fragmentLimit))) {
    iVar2 = Image::
            poll<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                      (this_01,fragmentHandler,fragmentLimit - iVar5);
    uVar7 = uVar7 + 1;
    this_01 = this_01 + 1;
    uVar6 = (ulong)(uint)(iVar5 + iVar2);
  }
  return iVar5;
}

Assistant:

inline int poll(F&& fragmentHandler, int fragmentLimit)
    {
        const struct ImageList *imageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        const std::size_t length = imageList->m_length;
        Image *images = imageList->m_images;
        int fragmentsRead = 0;

        std::size_t startingIndex = m_roundRobinIndex++;
        if (startingIndex >= length)
        {
            m_roundRobinIndex = startingIndex = 0;
        }

        for (std::size_t i = startingIndex; i < length && fragmentsRead < fragmentLimit; i++)
        {
            fragmentsRead += images[i].poll(fragmentHandler, fragmentLimit - fragmentsRead);
        }

        for (std::size_t i = 0; i < startingIndex && fragmentsRead < fragmentLimit; i++)
        {
            fragmentsRead += images[i].poll(fragmentHandler, fragmentLimit - fragmentsRead);
        }

        return fragmentsRead;
    }